

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::TestSpecParser::addFilter(TestSpecParser *this)

{
  bool bVar1;
  Filter local_40;
  TestSpecParser *local_10;
  TestSpecParser *this_local;
  
  local_10 = this;
  bVar1 = std::
          vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
          ::empty(&(this->m_currentFilter).m_required);
  if ((!bVar1) ||
     (bVar1 = std::
              vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
              ::empty(&(this->m_currentFilter).m_forbidden), !bVar1)) {
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::push_back
              (&(this->m_testSpec).m_filters,&this->m_currentFilter);
    memset(&local_40,0,0x30);
    TestSpec::Filter::Filter(&local_40);
    TestSpec::Filter::operator=(&this->m_currentFilter,&local_40);
    TestSpec::Filter::~Filter(&local_40);
  }
  return;
}

Assistant:

void TestSpecParser::addFilter() {
        if (!m_currentFilter.m_required.empty() || !m_currentFilter.m_forbidden.empty()) {
            m_testSpec.m_filters.push_back(std::move(m_currentFilter));
            m_currentFilter = TestSpec::Filter();
        }
    }